

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

uint luaS_hashlongstr(TString *ts)

{
  uint uVar1;
  size_t sVar2;
  
  if (ts->extra == '\0') {
    sVar2 = (ts->u).lnglen;
    uVar1 = ts->hash ^ (uint)sVar2;
    if (sVar2 != 0) {
      do {
        uVar1 = uVar1 ^ (uint)(byte)ts->contents[sVar2 - 1] + (uVar1 >> 2) + uVar1 * 0x20;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
    }
    ts->hash = uVar1;
    ts->extra = '\x01';
  }
  return ts->hash;
}

Assistant:

unsigned luaS_hashlongstr (TString *ts) {
  lua_assert(ts->tt == LUA_VLNGSTR);
  if (ts->extra == 0) {  /* no hash? */
    size_t len = ts->u.lnglen;
    ts->hash = luaS_hash(getlngstr(ts), len, ts->hash);
    ts->extra = 1;  /* now it has its hash */
  }
  return ts->hash;
}